

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<slang::ast::LValue_*>::reallocateTo
          (SmallVectorBase<slang::ast::LValue_*> *this,size_type newCapacity)

{
  LValue **__last;
  EVP_PKEY_CTX *ctx;
  LValue **in_RSI;
  SmallVectorBase<slang::ast::LValue_*> *in_RDI;
  pointer newData;
  
  __last = (LValue **)operator_new(0xa90306);
  begin(in_RDI);
  ctx = (EVP_PKEY_CTX *)end(in_RDI);
  std::uninitialized_move<slang::ast::LValue**,slang::ast::LValue**>
            (in_RSI,__last,(LValue **)in_RDI);
  cleanup(in_RDI,ctx);
  in_RDI->cap = (size_type)in_RSI;
  in_RDI->data_ = __last;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }